

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonEachComputePath(JsonEachCursor *p,JsonString *pStr,u32 i)

{
  uint i_00;
  JsonNode *pJVar1;
  u32 iUp;
  JsonNode *pUp;
  JsonNode *pNode;
  u32 i_local;
  JsonString *pStr_local;
  JsonEachCursor *p_local;
  
  if (i == 0) {
    jsonAppendChar(pStr,'$');
  }
  else {
    i_00 = (p->sParse).aUp[i];
    jsonEachComputePath(p,pStr,i_00);
    pUp = (p->sParse).aNode + i;
    pJVar1 = (p->sParse).aNode + i_00;
    if (pJVar1->eType == '\x06') {
      jsonPrintf(0x1e,pStr,"[%d]",(ulong)(pJVar1->u).iAppend);
    }
    else {
      if ((pUp->jnFlags & 0x40) == 0) {
        pUp = pUp + -1;
      }
      jsonPrintf(pUp->n + 1,pStr,".%.*s",(ulong)(pUp->n - 2),&((pUp->u).pPatch)->jnFlags);
    }
  }
  return;
}

Assistant:

static void jsonEachComputePath(
  JsonEachCursor *p,       /* The cursor */
  JsonString *pStr,        /* Write the path here */
  u32 i                    /* Path to this element */
){
  JsonNode *pNode, *pUp;
  u32 iUp;
  if( i==0 ){
    jsonAppendChar(pStr, '$');
    return;
  }
  iUp = p->sParse.aUp[i];
  jsonEachComputePath(p, pStr, iUp);
  pNode = &p->sParse.aNode[i];
  pUp = &p->sParse.aNode[iUp];
  if( pUp->eType==JSON_ARRAY ){
    jsonPrintf(30, pStr, "[%d]", pUp->u.iKey);
  }else{
    assert( pUp->eType==JSON_OBJECT );
    if( (pNode->jnFlags & JNODE_LABEL)==0 ) pNode--;
    assert( pNode->eType==JSON_STRING );
    assert( pNode->jnFlags & JNODE_LABEL );
    jsonPrintf(pNode->n+1, pStr, ".%.*s", pNode->n-2, pNode->u.zJContent+1);
  }
}